

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

int __thiscall capnp::SchemaLoader::InitializerImpl::init(InitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  LazyLoadCallback *pLVar1;
  Mutex *pMVar2;
  RawSchema *extraout_RAX;
  RawSchema *schema_local;
  Fault f;
  RawSchema *mutableSchema;
  Locked<const_kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> lock;
  DebugComparison<capnp::_::RawSchema_*&,_const_capnp::_::RawSchema_*&> _kjCondition;
  
  pLVar1 = (this->callback).ptr;
  schema_local = (RawSchema *)ctx;
  if (pLVar1 != (LazyLoadCallback *)0x0) {
    (**pLVar1->_vptr_LazyLoadCallback)(pLVar1,this->loader,*(undefined8 *)ctx);
  }
  mutableSchema = schema_local;
  if (schema_local->lazyInitializer != (Initializer *)0x0) {
    pMVar2 = (Mutex *)this->loader;
    _kjCondition.left = (RawSchema **)((ulong)_kjCondition.left & 0xffffffffffffff00);
    kj::_::Mutex::lock(pMVar2,1);
    lock.ptr = (Own<capnp::SchemaLoader::Impl,_std::nullptr_t> *)(pMVar2 + 1);
    f.exception = (Exception *)schema_local->id;
    lock.mutex = pMVar2;
    kj::
    Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
    ::find<0ul,unsigned_long&>
              ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                *)&_kjCondition,(unsigned_long *)&pMVar2[1].waitersHead.ptr[2].prev);
    if (_kjCondition.left == (RawSchema **)0x0) {
      mutableSchema = (RawSchema *)0x0;
    }
    else {
      mutableSchema = _kjCondition.left[1];
    }
    _kjCondition.left = &mutableSchema;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.result = mutableSchema == schema_local;
    _kjCondition.op.content.size_ = 5;
    if (!_kjCondition.result) {
      _kjCondition.right = &schema_local;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawSchema*&,capnp::_::RawSchema_const*&>&,char_const(&)[60]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x823,FAILED,"mutableSchema == schema",
                 "_kjCondition,\"A schema not belonging to this loader used its initializer.\"",
                 &_kjCondition,
                 (char (*) [60])"A schema not belonging to this loader used its initializer.");
      kj::_::Debug::Fault::fatal(&f);
    }
    mutableSchema->lazyInitializer = (Initializer *)0x0;
    (mutableSchema->defaultBrand).lazyInitializer = (Initializer *)0x0;
    if (lock.mutex != (Mutex *)0x0) {
      _kjCondition.right = &schema_local;
      kj::_::Mutex::unlock(lock.mutex,SHARED,(Waiter *)0x0);
      mutableSchema = extraout_RAX;
    }
  }
  return (int)mutableSchema;
}

Assistant:

void SchemaLoader::InitializerImpl::init(const _::RawSchema* schema) const {
  KJ_IF_SOME(c, callback) {
    c.load(loader, schema->id);
  }

  if (schema->lazyInitializer != nullptr) {
    // The callback declined to load a schema.  We need to disable the initializer so that it
    // doesn't get invoked again later, as we can no longer modify this schema once it is in use.

    // Lock the loader for read to make sure no one is concurrently loading a replacement for this
    // schema node.
    auto lock = loader.impl.lockShared();

    // Get the mutable version of the schema.
    _::RawSchema* mutableSchema = lock->get()->tryGet(schema->id).schema;
    KJ_ASSERT(mutableSchema == schema,
              "A schema not belonging to this loader used its initializer.");

    // Disable the initializer.
#if __GNUC__ || defined(__clang__)
    __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
    __atomic_store_n(&mutableSchema->defaultBrand.lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
    std::atomic_thread_fence(std::memory_order_release);
    *static_cast<_::RawSchema::Initializer const* volatile*>(
        &mutableSchema->lazyInitializer) = nullptr;
    *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
        &mutableSchema->defaultBrand.lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
  }
}